

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetShaderTypeLiteralName(SHADER_TYPE ShaderType)

{
  Char *Message;
  uint *in_RCX;
  SHADER_TYPE local_3c;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  SHADER_TYPE ShaderType_local;
  
  if (ShaderType == SHADER_TYPE_UNKNOWN) {
    pcStack_10 = "SHADER_TYPE_UNKNOWN";
  }
  else if (ShaderType == SHADER_TYPE_VERTEX) {
    pcStack_10 = "SHADER_TYPE_VERTEX";
  }
  else if (ShaderType == SHADER_TYPE_PIXEL) {
    pcStack_10 = "SHADER_TYPE_PIXEL";
  }
  else if (ShaderType == SHADER_TYPE_GEOMETRY) {
    pcStack_10 = "SHADER_TYPE_GEOMETRY";
  }
  else if (ShaderType == SHADER_TYPE_HULL) {
    pcStack_10 = "SHADER_TYPE_HULL";
  }
  else if (ShaderType == SHADER_TYPE_DOMAIN) {
    pcStack_10 = "SHADER_TYPE_DOMAIN";
  }
  else if (ShaderType == SHADER_TYPE_COMPUTE) {
    pcStack_10 = "SHADER_TYPE_COMPUTE";
  }
  else if (ShaderType == SHADER_TYPE_AMPLIFICATION) {
    pcStack_10 = "SHADER_TYPE_AMPLIFICATION";
  }
  else if (ShaderType == SHADER_TYPE_MESH) {
    pcStack_10 = "SHADER_TYPE_MESH";
  }
  else if (ShaderType == SHADER_TYPE_RAY_GEN) {
    pcStack_10 = "SHADER_TYPE_RAY_GEN";
  }
  else if (ShaderType == SHADER_TYPE_RAY_MISS) {
    pcStack_10 = "SHADER_TYPE_RAY_MISS";
  }
  else if (ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT) {
    pcStack_10 = "SHADER_TYPE_RAY_CLOSEST_HIT";
  }
  else if (ShaderType == SHADER_TYPE_RAY_ANY_HIT) {
    pcStack_10 = "SHADER_TYPE_RAY_ANY_HIT";
  }
  else if (ShaderType == SHADER_TYPE_RAY_INTERSECTION) {
    pcStack_10 = "SHADER_TYPE_RAY_INTERSECTION";
  }
  else if (ShaderType == SHADER_TYPE_CALLABLE) {
    pcStack_10 = "SHADER_TYPE_CALLABLE";
  }
  else if (ShaderType == SHADER_TYPE_LAST) {
    pcStack_10 = "SHADER_TYPE_TILE";
  }
  else {
    local_3c = ShaderType;
    msg.field_2._12_4_ = ShaderType;
    FormatString<char[30],unsigned_int>
              ((string *)local_38,(Diligent *)"Unknown shader type constant ",
               (char (*) [30])&local_3c,in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderTypeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x325);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "<Unknown shader type>";
  }
  return pcStack_10;
}

Assistant:

const Char* GetShaderTypeLiteralName(SHADER_TYPE ShaderType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please handle the new shader type in the switch below");
    switch (ShaderType)
    {
        // clang-format off
#define RETURN_SHADER_TYPE_NAME(ShaderType)\
        case ShaderType: return #ShaderType;

        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_UNKNOWN         )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_VERTEX          )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_PIXEL           )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_GEOMETRY        )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_HULL            )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_DOMAIN          )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_COMPUTE         )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_AMPLIFICATION   )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_MESH            )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_GEN         )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_MISS        )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_CLOSEST_HIT )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_ANY_HIT     )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_INTERSECTION)
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_CALLABLE        )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_TILE            )
#undef  RETURN_SHADER_TYPE_NAME
            // clang-format on

        default: UNEXPECTED("Unknown shader type constant ", Uint32{ShaderType}); return "<Unknown shader type>";
    }
}